

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::ILikeOperator,bool,true,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char **ppcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  char **local_80;
  anon_union_16_2_67f50693_for_value local_68;
  ulong local_58;
  ulong local_50;
  anon_union_16_2_67f50693_for_value local_48;
  ValidityMask *local_38;
  
  local_50 = count;
  local_38 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = *(undefined8 *)&ldata->value;
      pcVar4 = (ldata->value).pointer.ptr;
      local_80 = &(rdata->value).pointer.ptr;
      iVar13 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_80 + -1);
        local_48._0_4_ = paVar1->length;
        local_48._4_1_ = paVar1->prefix[0];
        local_48._5_1_ = paVar1->prefix[1];
        local_48._6_1_ = paVar1->prefix[2];
        local_48._7_1_ = paVar1->prefix[3];
        local_48.pointer.ptr = *local_80;
        local_68._0_8_ = uVar3;
        local_68.pointer.ptr = pcVar4;
        bVar5 = ILikeOperatorFunction
                          ((string_t *)&local_68.pointer,(string_t *)&local_48.pointer,'\0');
        result_data[iVar13] = bVar5;
        iVar13 = iVar13 + 1;
        local_80 = local_80 + 2;
      } while (local_50 != iVar13);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_58 = count + 0x3f >> 6;
    uVar10 = 0;
    uVar7 = 0;
    do {
      puVar2 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        uVar8 = puVar2[uVar10];
      }
      uVar12 = uVar7 + 0x40;
      if (local_50 <= uVar7 + 0x40) {
        uVar12 = local_50;
      }
      uVar6 = uVar12;
      if (uVar8 != 0) {
        uVar6 = uVar7;
        if (uVar8 == 0xffffffffffffffff) {
          if (uVar7 < uVar12) {
            uVar3 = *(undefined8 *)&ldata->value;
            pcVar4 = (ldata->value).pointer.ptr;
            ppcVar9 = &rdata[uVar7].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
              local_48._0_4_ = paVar1->length;
              local_48._4_1_ = paVar1->prefix[0];
              local_48._5_1_ = paVar1->prefix[1];
              local_48._6_1_ = paVar1->prefix[2];
              local_48._7_1_ = paVar1->prefix[3];
              local_48.pointer.ptr = *ppcVar9;
              local_68._0_8_ = uVar3;
              local_68.pointer.ptr = pcVar4;
              bVar5 = ILikeOperatorFunction
                                ((string_t *)&local_68.pointer,(string_t *)&local_48.pointer,'\0');
              result_data[uVar6] = bVar5;
              uVar6 = uVar6 + 1;
              ppcVar9 = ppcVar9 + 2;
            } while (uVar12 != uVar6);
          }
        }
        else if (uVar7 < uVar12) {
          ppcVar9 = &rdata[uVar7].value.pointer.ptr;
          uVar11 = 0;
          do {
            if ((uVar8 >> (uVar11 & 0x3f) & 1) != 0) {
              local_68._0_8_ = *(undefined8 *)&ldata->value;
              local_68.pointer.ptr = (ldata->value).pointer.ptr;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
              local_48._0_4_ = paVar1->length;
              local_48._4_1_ = paVar1->prefix[0];
              local_48._5_1_ = paVar1->prefix[1];
              local_48._6_1_ = paVar1->prefix[2];
              local_48._7_1_ = paVar1->prefix[3];
              local_48.pointer.ptr = *ppcVar9;
              bVar5 = ILikeOperatorFunction
                                ((string_t *)&local_68.pointer,(string_t *)&local_48.pointer,'\0');
              result_data[uVar7] = bVar5;
            }
            uVar7 = uVar7 + 1;
            ppcVar9 = ppcVar9 + 2;
            uVar11 = uVar11 + 1;
            uVar6 = uVar7;
          } while (uVar12 != uVar7);
        }
      }
      uVar10 = uVar10 + 1;
      uVar7 = uVar6;
    } while (uVar10 != local_58);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}